

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::DataPageHeaderV2::printTo(DataPageHeaderV2 *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  string local_40;
  
  std::operator<<(out,"DataPageHeaderV2(");
  poVar1 = std::operator<<(out,"num_values=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->num_values);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"num_nulls=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->num_nulls);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"num_rows=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->num_rows);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->encoding,val);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"definition_levels_byte_length=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->definition_levels_byte_length);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"repetition_levels_byte_length=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->repetition_levels_byte_length);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"is_compressed=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&local_40,&this->is_compressed);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"statistics=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(&local_40,&this->statistics);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void DataPageHeaderV2::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DataPageHeaderV2(";
  out << "num_values=" << to_string(num_values);
  out << ", " << "num_nulls=" << to_string(num_nulls);
  out << ", " << "num_rows=" << to_string(num_rows);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "definition_levels_byte_length=" << to_string(definition_levels_byte_length);
  out << ", " << "repetition_levels_byte_length=" << to_string(repetition_levels_byte_length);
  out << ", " << "is_compressed="; (__isset.is_compressed ? (out << to_string(is_compressed)) : (out << "<null>"));
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ")";
}